

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ly_ctx_new_yldata(char *search_dir,lyd_node *tree,int options,ly_ctx **ctx)

{
  int iVar1;
  lyd_node *plVar2;
  bool bVar3;
  lyd_node *local_c0;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  LY_ERR local_94;
  uint local_90;
  uint32_t j;
  uint32_t i;
  ly_bool no_expl_compile;
  ly_ctx *ctx_new;
  lys_module *mod;
  undefined1 local_70 [4];
  LY_ERR ret;
  ly_set features;
  char **feature_arr;
  ly_set *set;
  lyd_node *node;
  lyd_node *module;
  char *revision;
  char *name;
  ly_ctx **ctx_local;
  lyd_node *plStack_20;
  int options_local;
  lyd_node *tree_local;
  char *search_dir_local;
  
  revision = (char *)0x0;
  module = (lyd_node *)0x0;
  feature_arr = (char **)0x0;
  features.field_2.dnodes = (lyd_node **)0x0;
  name = (char *)ctx;
  ctx_local._4_4_ = options;
  plStack_20 = tree;
  tree_local = (lyd_node *)search_dir;
  memset(local_70,0,0x10);
  mod._4_4_ = 0;
  _i = (ly_ctx *)0x0;
  if (plStack_20 == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree","ly_ctx_new_yldata"
          );
    return LY_EINVAL;
  }
  if (name == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx","ly_ctx_new_yldata")
    ;
    return LY_EINVAL;
  }
  if (*(long *)name == 0) {
    mod._4_4_ = ly_ctx_new((char *)tree_local,(uint16_t)ctx_local._4_4_,(ly_ctx **)&i);
    if (mod._4_4_ != LY_SUCCESS) goto LAB_0012471f;
  }
  else {
    _i = *(ly_ctx **)name;
  }
  mod._4_4_ = 0;
  bVar3 = (ctx_local._4_4_ & 0x80) == 0;
  if (bVar3) {
    _i->flags = _i->flags | 0x80;
  }
  mod._4_4_ = lyd_find_xpath(plStack_20,"/ietf-yang-library:yang-library/module-set[1]/module",
                             (ly_set **)&feature_arr);
  if (mod._4_4_ == LY_SUCCESS) {
    if (*(int *)((long)feature_arr + 4) == 0) {
      mod._4_4_ = ly_ctx_new_yl_legacy(_i,plStack_20);
      if (mod._4_4_ != LY_SUCCESS) goto LAB_0012471f;
      mod._4_4_ = 0;
    }
    else {
      mod._4_4_ = 0;
      for (local_90 = 0; local_90 < *(uint *)((long)feature_arr + 4); local_90 = local_90 + 1) {
        node = *(lyd_node **)(feature_arr[1] + (ulong)local_90 * 8);
        revision = (char *)0x0;
        module = (lyd_node *)0x0;
        for (set = (ly_set *)lyd_child(node); set != (ly_set *)0x0;
            set = (ly_set *)set[1].field_2.dnodes) {
          iVar1 = strcmp((char *)(set->field_2).dnodes[5],"name");
          if (iVar1 == 0) {
            revision = lyd_get_value((lyd_node *)set);
          }
          else {
            iVar1 = strcmp((char *)(set->field_2).dnodes[5],"revision");
            if (iVar1 == 0) {
              module = (lyd_node *)lyd_get_value((lyd_node *)set);
            }
            else {
              iVar1 = strcmp((char *)(set->field_2).dnodes[5],"feature");
              if (iVar1 == 0) {
                mod._4_4_ = ly_set_add((ly_set *)local_70,set,'\0',(uint32_t *)0x0);
                if (mod._4_4_ != LY_SUCCESS) goto LAB_0012471f;
                mod._4_4_ = 0;
              }
            }
          }
        }
        features.field_2.dnodes = (lyd_node **)malloc((ulong)(ret + LY_EMEM) << 3);
        if (features.field_2.dnodes == (lyd_node **)0x0) {
          mod._4_4_ = LY_EMEM;
          goto LAB_0012471f;
        }
        for (local_94 = LY_SUCCESS; local_94 < ret; local_94 = local_94 + LY_EMEM) {
          plVar2 = (lyd_node *)lyd_get_value(*(lyd_node **)(features._0_8_ + (ulong)local_94 * 8));
          features.field_2.dnodes[local_94] = plVar2;
        }
        features.field_2.dnodes[ret] = (lyd_node *)0x0;
        ly_set_clean((ly_set *)local_70,(_func_void_void_ptr *)0x0);
        ctx_new = (ly_ctx *)
                  ly_ctx_load_module(_i,revision,(char *)module,(char **)features.field_2.dnodes);
        free(features.field_2.dnodes);
        if (ctx_new == (ly_ctx *)0x0) {
          if (*(long *)name == 0) {
            if (plStack_20->schema == (lysc_node *)0x0) {
              local_a8 = (ly_ctx *)plStack_20[2].schema;
            }
            else {
              local_a8 = plStack_20->schema->module->ctx;
            }
            local_a0 = local_a8;
          }
          else {
            local_a0 = *(ly_ctx **)name;
          }
          if (module == (lyd_node *)0x0) {
            local_c0 = (lyd_node *)0x2427b0;
          }
          else {
            local_c0 = module;
          }
          ly_log(local_a0,LY_LLERR,LY_EINVAL,
                 "Unable to load module %s@%s specified by yang library data.",revision,local_c0);
          mod._4_4_ = LY_EINVAL;
          goto LAB_0012471f;
        }
      }
    }
    mod._4_4_ = ly_ctx_compile(_i);
    if ((mod._4_4_ == LY_SUCCESS) && (bVar3)) {
      _i->flags = _i->flags & 0xff7f;
    }
  }
LAB_0012471f:
  ly_set_free((ly_set *)feature_arr,(_func_void_void_ptr *)0x0);
  ly_set_erase((ly_set *)local_70,(_func_void_void_ptr *)0x0);
  if ((*(long *)name == 0) && (*(ly_ctx **)name = _i, mod._4_4_ != LY_SUCCESS)) {
    ly_ctx_destroy(*(ly_ctx **)name);
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
  }
  return mod._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_new_yldata(const char *search_dir, const struct lyd_node *tree, int options, struct ly_ctx **ctx)
{
    const char *name = NULL, *revision = NULL;
    struct lyd_node *module, *node;
    struct ly_set *set = NULL;
    const char **feature_arr = NULL;
    struct ly_set features = {0};
    LY_ERR ret = LY_SUCCESS;
    const struct lys_module *mod;
    struct ly_ctx *ctx_new = NULL;
    ly_bool no_expl_compile = 0;
    uint32_t i, j;

    LY_CHECK_ARG_RET(NULL, tree, ctx, LY_EINVAL);

    /* create a new context */
    if (*ctx == NULL) {
        LY_CHECK_GOTO(ret = ly_ctx_new(search_dir, options, &ctx_new), cleanup);
    } else {
        ctx_new = *ctx;
    }

    /* redundant to compile modules one-by-one */
    if (!(options & LY_CTX_EXPLICIT_COMPILE)) {
        ctx_new->flags |= LY_CTX_EXPLICIT_COMPILE;
        no_expl_compile = 1;
    }

    LY_CHECK_GOTO(ret = lyd_find_xpath(tree, "/ietf-yang-library:yang-library/module-set[1]/module", &set), cleanup);
    if (set->count == 0) {
        /* perhaps a legacy data tree? */
        LY_CHECK_GOTO(ret = ly_ctx_new_yl_legacy(ctx_new, tree), cleanup);
    } else {
        /* process the data tree */
        for (i = 0; i < set->count; ++i) {
            module = set->dnodes[i];

            /* initiate */
            name = NULL;
            revision = NULL;

            /* iterate over data */
            LY_LIST_FOR(lyd_child(module), node) {
                if (!strcmp(node->schema->name, "name")) {
                    name = lyd_get_value(node);
                } else if (!strcmp(node->schema->name, "revision")) {
                    revision = lyd_get_value(node);
                } else if (!strcmp(node->schema->name, "feature")) {
                    LY_CHECK_GOTO(ret = ly_set_add(&features, node, 0, NULL), cleanup);
                }
            }

            feature_arr = malloc((features.count + 1) * sizeof *feature_arr);
            LY_CHECK_ERR_GOTO(!feature_arr, ret = LY_EMEM, cleanup);

            /* parse features into an array of strings */
            for (j = 0; j < features.count; ++j) {
                feature_arr[j] = lyd_get_value(features.dnodes[j]);
            }
            feature_arr[features.count] = NULL;
            ly_set_clean(&features, NULL);

            /* use the gathered data to load the module */
            mod = ly_ctx_load_module(ctx_new, name, revision, feature_arr);
            free(feature_arr);
            if (!mod) {
                LOGERR(*ctx ? *ctx : LYD_CTX(tree), LY_EINVAL, "Unable to load module %s@%s specified by yang library data.",
                        name, revision ? revision : "<none>");
                ret = LY_EINVAL;
                goto cleanup;
            }
        }
    }

    /* compile */
    LY_CHECK_GOTO(ret = ly_ctx_compile(ctx_new), cleanup);

    if (no_expl_compile) {
        /* unset flag */
        ctx_new->flags &= ~LY_CTX_EXPLICIT_COMPILE;
    }

cleanup:
    ly_set_free(set, NULL);
    ly_set_erase(&features, NULL);
    if (*ctx == NULL) {
        *ctx = ctx_new;
        if (ret) {
            ly_ctx_destroy(*ctx);
            *ctx = NULL;
        }
    }
    return ret;
}